

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteConObjExpressions
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this)

{
  uint uVar1;
  NLHeader *pNVar2;
  char *pcVar3;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *in_RDI;
  ExprArgWriter *in_stack_00000010;
  int in_stack_0000001c;
  NLFeeder_Easy *in_stack_00000020;
  ExprArgWriter ew_2;
  ExprArgWriter ew_1;
  ExprArgWriter ew;
  int i;
  char *in_stack_ffffffffffffff38;
  int iVar4;
  NLFeeder_Easy *in_stack_ffffffffffffff40;
  File *in_stack_ffffffffffffff48;
  int i_00;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  ExprArgWriter local_50;
  ExprArgWriter local_40 [2];
  ExprArgWriter local_20;
  uint local_c;
  
  for (local_c = 0; uVar1 = local_c, pNVar2 = Hdr(in_RDI),
      (int)uVar1 < (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons;
      local_c = local_c + 1) {
    WriteDefinedVariables
              ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    uVar1 = local_c;
    Feeder(in_RDI);
    pcVar3 = NLFeeder_Easy::ConDescription
                       ((NLFeeder_Easy *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    BinaryFormatter::apr
              (&in_RDI->super_FormatterType,&in_RDI->nm,"%c%d\t#%s\n",0x43,(ulong)uVar1,pcVar3);
    ExprArgWriter::ExprArgWriter(&local_20,in_RDI,1);
    Feeder(in_RDI);
    NLFeeder<mp::NLFeeder_Easy,void*>::
    FeedConExpression<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ExprArgWriter>
              ((NLFeeder<mp::NLFeeder_Easy,_void_*> *)in_stack_ffffffffffffff40,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(ExprArgWriter *)0x13e0e0);
    ExprArgWriter::~ExprArgWriter(&local_20);
  }
  while( true ) {
    uVar1 = local_c;
    pNVar2 = Hdr(in_RDI);
    iVar4 = (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons;
    pNVar2 = Hdr(in_RDI);
    if (iVar4 + (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons <= (int)uVar1)
    break;
    WriteDefinedVariables
              ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    uVar1 = local_c;
    pNVar2 = Hdr(in_RDI);
    iVar4 = (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons;
    Feeder(in_RDI);
    pcVar3 = NLFeeder_Easy::ConDescription
                       ((NLFeeder_Easy *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    BinaryFormatter::apr
              (&in_RDI->super_FormatterType,&in_RDI->nm,"%c%d\t#%s\n",0x4c,(ulong)(uVar1 - iVar4),
               pcVar3);
    ExprArgWriter::ExprArgWriter(local_40,in_RDI,1);
    Feeder(in_RDI);
    NLFeeder<mp::NLFeeder_Easy,void*>::
    FeedConExpression<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ExprArgWriter>
              ((NLFeeder<mp::NLFeeder_Easy,_void_*> *)in_stack_ffffffffffffff40,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(ExprArgWriter *)0x13e227);
    ExprArgWriter::~ExprArgWriter(local_40);
    local_c = local_c + 1;
  }
  local_c = 0;
  while( true ) {
    uVar1 = local_c;
    iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    i_00 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    pNVar2 = Hdr(in_RDI);
    if ((pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_objs <= (int)uVar1) break;
    WriteDefinedVariables
              ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),i_00);
    in_stack_ffffffffffffff48 = &in_RDI->nm;
    in_stack_ffffffffffffff50 = local_c;
    Feeder(in_RDI);
    in_stack_ffffffffffffff54 = NLFeeder_Easy::ObjType(in_stack_ffffffffffffff40,iVar4);
    Feeder(in_RDI);
    in_stack_ffffffffffffff38 = NLFeeder_Easy::ObjDescription(in_stack_ffffffffffffff40,iVar4);
    BinaryFormatter::apr
              (&in_RDI->super_FormatterType,in_stack_ffffffffffffff48,"%c%d %d\t#%s\n",0x4f,
               (ulong)in_stack_ffffffffffffff50,(ulong)in_stack_ffffffffffffff54);
    ExprArgWriter::ExprArgWriter(&local_50,in_RDI,1);
    Feeder(in_RDI);
    NLFeeder_Easy::
    FeedObjExpression<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ExprArgWriter>
              (in_stack_00000020,in_stack_0000001c,in_stack_00000010);
    ExprArgWriter::~ExprArgWriter(&local_50);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteConObjExpressions() {
  int i=0;
  for (; i<Hdr().num_algebraic_cons; ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'C', i,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (;
       i<Hdr().num_algebraic_cons + Hdr().num_logical_cons;
       ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'L',
        i - Hdr().num_algebraic_cons,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (i=0; i<Hdr().num_objs; ++i) {
    WriteDefinedVariables(-i-1);              // -i-1
    apr(nm, "%c%d %d\t#%s\n", 'O', i,
        (int)Feeder().ObjType(i),
        Feeder().ObjDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedObjExpression(i, ew);
  }
}